

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu_registers.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_546e0c::PpuMask_render_background_returns_true_for_bit_three_Test::TestBody
          (PpuMask_render_background_returns_true_for_bit_three_Test *this)

{
  return;
}

Assistant:

TEST(PpuMask, render_background_returns_true_for_bit_three) {
    PpuMask mask{};
    EXPECT_FALSE(mask.render_background());

    mask = PpuMask(0b0000'1000);
    EXPECT_TRUE(mask.render_background());
}